

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

xmlParserInputBufferPtr xmlAllocParserInputBuffer(xmlCharEncoding enc)

{
  int iVar1;
  xmlBufPtr pxVar2;
  xmlParserInputBufferPtr ret;
  xmlParserInputBufferPtr pxStack_10;
  xmlCharEncoding enc_local;
  
  pxStack_10 = (xmlParserInputBufferPtr)(*xmlMalloc)(0x40);
  if (pxStack_10 == (xmlParserInputBufferPtr)0x0) {
    pxStack_10 = (xmlParserInputBufferPtr)0x0;
  }
  else {
    memset(pxStack_10,0,0x40);
    pxVar2 = xmlBufCreate(6000);
    pxStack_10->buffer = pxVar2;
    if (pxStack_10->buffer == (xmlBufPtr)0x0) {
      (*xmlFree)(pxStack_10);
      pxStack_10 = (xmlParserInputBufferPtr)0x0;
    }
    else if ((enc == XML_CHAR_ENCODING_NONE) ||
            (iVar1 = xmlLookupCharEncodingHandler(enc,&pxStack_10->encoder), iVar1 == 0)) {
      if (pxStack_10->encoder == (xmlCharEncodingHandlerPtr)0x0) {
        pxStack_10->raw = (xmlBufPtr)0x0;
      }
      else {
        pxVar2 = xmlBufCreate(6000);
        pxStack_10->raw = pxVar2;
      }
      pxStack_10->readcallback = (xmlInputReadCallback)0x0;
      pxStack_10->closecallback = (xmlInputCloseCallback)0x0;
      pxStack_10->context = (void *)0x0;
      pxStack_10->compressed = -1;
      pxStack_10->rawconsumed = 0;
    }
    else {
      xmlFreeParserInputBuffer(pxStack_10);
      pxStack_10 = (xmlParserInputBufferPtr)0x0;
    }
  }
  return pxStack_10;
}

Assistant:

xmlParserInputBufferPtr
xmlAllocParserInputBuffer(xmlCharEncoding enc) {
    xmlParserInputBufferPtr ret;

    ret = (xmlParserInputBufferPtr) xmlMalloc(sizeof(xmlParserInputBuffer));
    if (ret == NULL) {
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlParserInputBuffer));
    ret->buffer = xmlBufCreate(XML_IO_BUFFER_SIZE);
    if (ret->buffer == NULL) {
        xmlFree(ret);
	return(NULL);
    }
    if (enc != XML_CHAR_ENCODING_NONE) {
        if (xmlLookupCharEncodingHandler(enc, &ret->encoder) != 0) {
            /* We can't handle errors properly here. */
            xmlFreeParserInputBuffer(ret);
            return(NULL);
        }
    }
    if (ret->encoder != NULL)
        ret->raw = xmlBufCreate(XML_IO_BUFFER_SIZE);
    else
        ret->raw = NULL;
    ret->readcallback = NULL;
    ret->closecallback = NULL;
    ret->context = NULL;
    ret->compressed = -1;
    ret->rawconsumed = 0;

    return(ret);
}